

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

int __thiscall branch_and_reduce_algorithm::packingReduction(branch_and_reduce_algorithm *this)

{
  vector<int,_std::allocator<int>_> *__x;
  int iVar1;
  long *plVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  int *piVar6;
  FILE *__stream;
  branch_and_reduce_algorithm *pbVar7;
  uint uVar8;
  uint *puVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  iterator __begin8;
  pointer piVar11;
  int *piVar12;
  int j;
  long lVar13;
  pointer pvVar14;
  pointer pvVar15;
  int iVar16;
  uint uVar17;
  pointer pvVar18;
  int *piVar19;
  int iVar20;
  int *piVar21;
  int j_1;
  int iVar22;
  ulong uVar23;
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar24;
  ulong uVar25;
  allocator_type local_c9;
  ulong local_c8;
  pointer local_c0;
  ulong local_b8;
  uint local_b0;
  uint local_ac;
  ulong local_a8;
  branch_and_reduce_algorithm *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  fast_set *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  int *local_70;
  vector<int,_std::allocator<int>_> x2;
  vector<int,_std::allocator<int>_> copyOfTmp;
  
  local_b0 = this->rn;
  __x = &this->x;
  std::vector<int,_std::allocator<int>_>::vector(&x2,__x);
  local_88 = &this->used;
  local_78 = &this->b_vtcs;
  local_80 = &this->packing_vtcs;
  local_ac = 0;
  local_a0 = this;
  iVar20 = -1;
  do {
    uVar17 = local_b0;
    __stream = _stderr;
    uVar23 = (ulong)local_ac;
    pvVar18 = (this->packing).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->packing).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18) / 0x18) <= uVar23
       ) {
      uVar8 = this->rn;
      if ((2 < debug) && (local_b0 != uVar8 && this->depth <= this->maxDepth)) {
        debugString_abi_cxx11_((string *)&copyOfTmp,this);
        fprintf(__stream,"%spacking: %d -> %d\n",
                copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,(ulong)uVar17,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&copyOfTmp);
        uVar8 = this->rn;
      }
      uVar17 = (uint)(uVar17 != uVar8);
LAB_0010e048:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&x2.super__Vector_base<int,_std::allocator<int>_>);
      return uVar17;
    }
    if (iVar20 != this->rn) {
      piVar11 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start;
      for (lVar13 = 0; lVar13 < this->N; lVar13 = lVar13 + 1) {
        x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar13] = piVar11[lVar13];
      }
      iVar20 = this->modifiedN + 1;
      lVar13 = (ulong)(uint)this->modifiedN << 4;
      while( true ) {
        iVar20 = iVar20 + -1;
        if (iVar20 < 1) break;
        plVar2 = *(long **)((long)&(this->modifieds).
                                   super__Vector_base<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].
                                   super___shared_ptr<modified,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                           lVar13);
        (**(code **)(*plVar2 + 0x18))(plVar2,&x2);
        lVar13 = lVar13 + -0x10;
      }
      iVar20 = this->rn;
    }
    pvVar18 = pvVar18 + uVar23;
    puVar9 = *(uint **)&(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data;
    piVar11 = *(pointer *)
               ((long)&(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + 8);
    local_c8 = (ulong)((int)((ulong)((long)piVar11 - (long)puVar9) >> 2) + ~*puVar9);
    local_b8 = 0;
    uVar23 = 0;
    local_c0 = pvVar18;
    local_90 = iVar20;
    for (uVar25 = 1; pbVar7 = local_a0, iVar20 = (int)uVar23,
        uVar25 < (ulong)((long)piVar11 - (long)puVar9 >> 2); uVar25 = (ulong)((int)uVar25 + 1)) {
      uVar17 = puVar9[uVar25];
      if (USE_DEPENDENCY_CHECKING == true) {
        pvVar18 = (local_a0->packingMap).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                           (pvVar18[(int)uVar17].super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            *(pointer *)
                             ((long)&pvVar18[(int)uVar17].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + 8),&local_ac);
        pvVar18 = local_c0;
        if (_Var10._M_current ==
            *(pointer *)
             ((long)&(pbVar7->packingMap).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
             8)) {
          __assert_fail("!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x8e3,"int branch_and_reduce_algorithm::packingReduction()");
        }
      }
      iVar22 = x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[(int)uVar17];
      if (iVar22 < 0) {
        iVar22 = (int)local_b8;
        local_b8 = (ulong)(iVar22 + 1);
        (local_a0->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar22] = uVar17;
        iVar22 = x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(int)uVar17];
      }
      uVar23 = (ulong)(iVar20 + (uint)(iVar22 == 1));
      puVar9 = *(uint **)&(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data;
      piVar11 = *(pointer *)
                 ((long)&(pvVar18->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + 8);
      this = local_a0;
    }
    local_a8 = uVar23;
    if ((int)local_c8 < iVar20) {
LAB_0010e045:
      uVar17 = 0xffffffff;
      goto LAB_0010e048;
    }
    iVar22 = (int)local_b8;
    pvVar18 = (pointer)(local_b8 & 0xffffffff);
    if (iVar22 < 1 || iVar20 != (int)local_c8) {
      if ((int)local_c8 < iVar20 + iVar22) {
        if (iVar22 < 2) {
          __assert_fail("size >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x924,"int branch_and_reduce_algorithm::packingReduction()");
        }
        fast_set::clear(local_88);
        piVar21 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (pvVar15 = (pointer)0x0; pvVar18 != pvVar15;
            pvVar15 = (pointer)((long)&(pvVar15->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data + 1)) {
          piVar3[piVar21[(long)pvVar15]] = (this->used).uid;
          piVar11[piVar21[(long)pvVar15]] = -1;
        }
        pvVar15 = (this->adj).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        piVar19 = *(pointer *)
                   ((long)&pvVar15[*piVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        local_94 = (int)local_a8 + 1;
        local_c0 = (pointer)((long)pvVar18 * 4);
        local_70 = piVar19;
        for (piVar21 = pvVar15[*piVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar21 != piVar19; piVar21 = piVar21 + 1)
        {
          iVar20 = *piVar21;
          piVar11 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((piVar11[iVar20] < 0) &&
             (piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start, piVar3[iVar20] != (this->used).uid)) {
            pvVar15 = (this->adj).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = *(pointer *)
                      ((long)&pvVar15[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            iVar22 = 0;
            piVar12 = pvVar15[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            for (piVar24 = piVar12; piVar24 != piVar6; piVar24 = piVar24 + 1) {
              if (piVar3[*piVar24] == (this->used).uid) {
                iVar22 = iVar22 + 1;
                piVar4[*piVar24] = 1;
              }
            }
            local_8c = (int)local_a8 + iVar22;
            if ((int)local_c8 < local_8c) {
              _Var10._M_current =
                   (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *_Var10._M_current = 2;
              iVar22 = 1;
              for (; piVar12 != piVar6; piVar12 = piVar12 + 1) {
                if (piVar11[*piVar12] < 0) {
                  _Var10._M_current[iVar22] = *piVar12;
                  iVar22 = iVar22 + 1;
                }
              }
              std::vector<int,std::allocator<int>>::
              vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&copyOfTmp,_Var10,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (_Var10._M_current + iVar22),&local_c9);
              pushPacking(this,&copyOfTmp);
              set(this,iVar20,1);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&copyOfTmp);
            }
            else {
              if (((0x1f < (uint)BRANCHING) || ((0x80000c00U >> (BRANCHING & 0x1fU) & 1) == 0)) ||
                 (iVar22 + local_94 <= (int)local_c8)) goto LAB_0010de79;
              pvVar15 = local_c0;
              for (pvVar14 = (pointer)0x0; pvVar15 != pvVar14;
                  pvVar14 = (pointer)((long)&(pvVar14->super__Vector_base<int,_std::allocator<int>_>
                                             )._M_impl.super__Vector_impl_data + 4)) {
                piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[*(int *)((long)piVar11 + (long)pvVar14)] == -1)
                {
                  this_00 = local_78;
                  if (BRANCHING == 0x1f) {
                    this_00 = local_80;
                  }
                  std::vector<int,_std::allocator<int>_>::push_back
                            (this_00,(value_type_conflict1 *)((long)piVar11 + (long)pvVar14));
                  pvVar15 = local_c0;
                }
              }
            }
            piVar19 = local_70;
            if ((int)local_c8 < local_8c) break;
          }
LAB_0010de79:
        }
      }
    }
    else {
      fast_set::clear(local_88);
      piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pvVar15 = (pointer)0x0; pvVar18 != pvVar15;
          pvVar15 = (pointer)((long)&(pvVar15->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data + 1)) {
        piVar4[piVar11[(long)pvVar15]] = (this->used).uid;
        piVar3[piVar11[(long)pvVar15]] = -1;
      }
      pvVar15 = (this->adj).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (pvVar14 = (pointer)0x0; pvVar14 != pvVar18;
          pvVar14 = (pointer)((long)&(pvVar14->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data + 1)) {
        iVar20 = piVar11[(long)pvVar14];
        piVar19 = *(pointer *)
                   ((long)&pvVar15[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        piVar3 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar21 = pvVar15[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar21 != piVar19; piVar21 = piVar21 + 1)
        {
          iVar20 = *piVar21;
          if (piVar3[iVar20] < 0) {
            iVar22 = (this->used).uid;
            iVar16 = 1;
            iVar1 = piVar5[iVar20];
            piVar5[iVar20] = iVar22;
            if (iVar1 == iVar22) {
              iVar16 = piVar4[iVar20];
              if (iVar16 < 0) goto LAB_0010e045;
              iVar16 = iVar16 + 1;
            }
            piVar4[iVar20] = iVar16;
          }
        }
      }
      pvVar15 = (pointer)0x0;
      while (pvVar15 != pvVar18) {
        pvVar14 = (this->adj).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar20 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar15];
        piVar19 = *(pointer *)
                   ((long)&pvVar14[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8);
        local_c0 = pvVar15;
        for (piVar21 = pvVar14[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar21 != piVar19; piVar21 = piVar21 + 1)
        {
          iVar20 = *piVar21;
          piVar11 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((piVar11[iVar20] < 0) &&
             ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar20] == 1)) {
            _Var10._M_current =
                 (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            *_Var10._M_current = 1;
            pvVar15 = (this->adj).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = *(pointer *)
                      ((long)&pvVar15[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            iVar22 = 1;
            for (piVar12 = pvVar15[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar12 != piVar6;
                piVar12 = piVar12 + 1) {
              iVar20 = *piVar12;
              if ((piVar11[iVar20] < 0) && (piVar3[iVar20] != (this->used).uid)) {
                _Var10._M_current[iVar22] = iVar20;
                iVar22 = iVar22 + 1;
              }
            }
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)&copyOfTmp,_Var10,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (_Var10._M_current + iVar22),&local_c9);
            pushPacking(this,&copyOfTmp);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&copyOfTmp);
          }
        }
        pvVar15 = (pointer)((long)&(local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data + 1);
      }
      for (pvVar15 = (pointer)0x0; pvVar18 != pvVar15;
          pvVar15 = (pointer)((long)&(pvVar15->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data + 1)) {
        iVar20 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pvVar15];
        if ((long)iVar20 == 1) goto LAB_0010e045;
        if (-1 < (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar20]) {
          __assert_fail("x[S[j]] < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x91e,"int branch_and_reduce_algorithm::packingReduction()");
        }
        set(this,iVar20,0);
      }
    }
    if (((uint)BRANCHING < 0x20) && ((0x80000c00U >> (BRANCHING & 0x1fU) & 1) != 0)) {
      if (1 < (int)local_b8 && (int)local_a8 == (int)local_c8 + -1) {
        lVar13 = 0;
        if (BRANCHING == 0x1f) {
          for (; (long)pvVar18 * 4 != lVar13; lVar13 = lVar13 + 4) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (local_80,(value_type_conflict1 *)
                                ((long)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar13));
          }
        }
        else {
          for (; (long)pvVar18 * 4 != lVar13; lVar13 = lVar13 + 4) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (local_78,(value_type_conflict1 *)
                                ((long)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar13));
          }
        }
      }
    }
    local_ac = local_ac + 1;
    iVar20 = local_90;
  } while( true );
}

Assistant:

int branch_and_reduce_algorithm::packingReduction()
{
    int oldn = rn;
#if 1
    std::vector<int> x2(x);
    int a = -1;
    for (unsigned int pi = 0; pi < packing.size(); ++pi)
    {
        std::vector<int> &ps = packing[pi];
        if (a != rn)
        {
            for (int j = 0; j < N; j++)
                x2[j] = x[j];
            for (int j = modifiedN - 1; j >= 0; j--)
            {
                modifieds[j]->reverse(x2);
            }
            a = rn;
        }
        int max = ps.size() - 1 - ps[0], sum = 0, size = 0;
        std::vector<int> &S = level;
        for (unsigned int j = 1; j < ps.size(); j++)
        {
            int v = ps[j];
            assert(!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end());
            if (x2[v] < 0)
                S[size++] = v;
            if (x2[v] == 1)
                sum++;
        }
        if (sum > max) // constraint not fulfilled => prune branch
        {
            return -1;
        }
        else if (sum == max && size > 0) // set x[v] = 0 for remaining vert.
        {
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int j = 0; j < size; j++) // check if there are adjacent vtcs among remaining vtcs.
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0)
                    {
                        if (used.add(u))
                        {
                            count[u] = 1;
                        }
                        else if (count[u] < 0) // adjacent vtcs => one of them has to be in the vc => prune
                        {
                            return -1;
                        }
                        else
                        {
                            count[u]++;
                        }
                    }
            }
            for (int j = 0; j < size; j++) // create new constraints
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0 && count[u] == 1)
                    {
                        std::vector<int> &tmp = que;
                        int p = 0;
                        tmp[p++] = 1;
                        for (int w : adj[u])
                            if (x[w] < 0 && !used.get(w))
                            {
                                tmp[p++] = w;
                            }
                        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
                        pushPacking(copyOfTmp);
                    }
            }
            for (int j = 0; j < size; j++) // set x[v] = 0 for remaining vtcs
            {
                if (S[j] == 1)
                    return -1;
                assert(x[S[j]] < 0);
                set(S[j], 0);
            }
        }
        else if (sum + size > max) // at least one of the remaining vtcs has to be excluded
        {
            assert(size >= 2);
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int v : adj[S[0]])
                if (x[v] < 0 && !used.get(v))
                {
                    int p = 0; // number of Neighbours in S[-]
                    for (int u : adj[v])
                        if (used.get(u))
                        {
                            p++;
                            count[u] = 1;
                        }
                    if (sum + p > max) // sum + p > max => v has to be in the vc
                    {
                        std::vector<int> &qs = que;
                        int q = 0;
                        qs[q++] = 2;
                        for (int u : adj[v])
                            if (x[u] < 0)
                                qs[q++] = u;
                        std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                        pushPacking(copyOfqs);
                        set(v, 1);
                        break;
                    }
                    else if (BRANCHING == 10 || BRANCHING == 11 || BRANCHING == 31)
                    {
                        if ((sum + 1 + p) > max)
                        {
                            for (int i = 0; i < size; i++)
                                if (count[S[i]] == -1) {
                                    if (BRANCHING == 31) packing_vtcs.push_back(S[i]);
                                    else b_vtcs.push_back(S[i]);
                                }
                        }
                    }
                }
        }

        if (BRANCHING == 10 || BRANCHING == 11 | BRANCHING == 31)
        {
            if (sum == (max - 1) && size > 1)
            {
                if (BRANCHING == 31) {
                    for (int i = 0; i < size; i++) {
                        packing_vtcs.push_back(S[i]);
                    }
                } else {
                    for (int i = 0; i < size; i++) {
                        b_vtcs.push_back(S[i]);
                    }
                }
            }
        }
    }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%spacking: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif // 0
    return oldn != rn ? 1 : 0;
}